

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O1

bool __thiscall chatter::Protocol::disconnect(Protocol *this,Peer *peer)

{
  PeerState PVar1;
  int in_R8D;
  ptr p;
  Packet *local_40;
  Peer *local_38;
  Packet *local_30;
  Peer *local_28;
  
  PVar1 = peer->m_state;
  if (PVar1 == CONNECTED) {
    Packet::create((Packet *)&local_40,0,'\0');
    local_40->m_peer = peer;
    Packet::set_type(local_40,DISCONNECT_NOTIFY);
    Packet::set_flag(local_40,RELIABLE);
    local_30 = local_40;
    local_28 = local_38;
    if (local_38 != (Peer *)0x0) {
      local_40 = (Packet *)&__libc_single_threaded;
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38->m_address).m_address = (local_38->m_address).m_address + 1;
        UNLOCK();
      }
      else {
        (local_38->m_address).m_address = (local_38->m_address).m_address + 1;
      }
    }
    send(this,(int)&local_30,(void *)0x1,(size_t)local_40,in_R8D);
    if (local_28 != (Peer *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
    }
    if (local_38 != (Peer *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
    }
  }
  return PVar1 == CONNECTED;
}

Assistant:

bool Protocol::disconnect(Peer* peer)
{
    if (peer->m_state != PeerState::CONNECTED)
        return false;

    auto p = Packet::create();
    p->m_peer = peer;
    p->set_type(PacketType::DISCONNECT_NOTIFY);
    p->set_flag(PacketFlag::RELIABLE);

    send(p, true);

    return true;
}